

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O2

void __thiscall QGraphicsSceneBspTreeIndex::clear(QGraphicsSceneBspTreeIndex *this)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  int i;
  ulong uVar4;
  
  lVar1 = *(long *)(this + 8);
  QGraphicsSceneBspTree::clear((QGraphicsSceneBspTree *)(lVar1 + 0x80));
  *(undefined4 *)(lVar1 + 0x104) = 0;
  QList<int>::clear((QList<int> *)(lVar1 + 0x150));
  uVar2 = *(ulong *)(lVar1 + 0x118);
  for (uVar4 = 0; uVar4 < uVar2; uVar4 = uVar4 + 1) {
    lVar3 = *(long *)(*(long *)(lVar1 + 0x110) + uVar4 * 8);
    if (lVar3 != 0) {
      *(undefined4 *)(*(long *)(lVar3 + 8) + 0x110) = 0xffffffff;
    }
  }
  QList<QGraphicsItem_*>::clear((QList<QGraphicsItem_*> *)(lVar1 + 0x108));
  QList<QGraphicsItem_*>::clear((QList<QGraphicsItem_*> *)(lVar1 + 0x120));
  QList<QGraphicsItem_*>::clear((QList<QGraphicsItem_*> *)(lVar1 + 0x138));
  *(undefined1 *)(lVar1 + 0x101) = 1;
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }